

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O2

void __thiscall FIWadManager::CheckLumpName(FIWadManager *this,char *name)

{
  uint *puVar1;
  FIWADInfo *pFVar2;
  int iVar3;
  long lVar4;
  uint i;
  ulong uVar5;
  uint j;
  ulong uVar6;
  
  for (uVar5 = 0; uVar5 < (this->mIWads).Count; uVar5 = uVar5 + 1) {
    lVar4 = 0;
    for (uVar6 = 0; pFVar2 = (this->mIWads).Array, uVar6 < pFVar2[uVar5].Lumps.Count;
        uVar6 = uVar6 + 1) {
      iVar3 = FString::CompareNoCase
                        ((FString *)((long)&(pFVar2[uVar5].Lumps.Array)->Chars + lVar4),name);
      if (iVar3 == 0) {
        puVar1 = (uint *)((this->mLumpsFound).Array + uVar5);
        *puVar1 = *puVar1 | 1 << ((byte)uVar6 & 0x1f);
      }
      lVar4 = lVar4 + 8;
    }
  }
  return;
}

Assistant:

void FIWadManager::CheckLumpName(const char *name)
{
	for(unsigned i=0; i< mIWads.Size(); i++)
	{
		for(unsigned j=0; j < mIWads[i].Lumps.Size(); j++)
		{
			if (!mIWads[i].Lumps[j].CompareNoCase(name))
			{
				mLumpsFound[i] |= (1<<j);
			}
		}
	}
}